

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  int max_field_number;
  int iVar5;
  Descriptor *this_00;
  long lVar6;
  int i;
  long lVar7;
  allocator<char> local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string message_id;
  
  psVar3 = &local_d0;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (psVar3,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "/**\n * Generated by JsPbCodeGenerator.\n * @param {Array=} opt_data Optional initial data array, typically from a\n * server response, or constructed directly in Javascript. The array is used\n * in place and becomes part of the constructed object. It is not cloned.\n * If no data is provided, the constructed object will be empty, but still\n * valid.\n * @extends {jspb.Message}\n * @constructor\n */\n$classname$ = function(opt_data) {\n"
                     ,"classname",psVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  message_id._M_dataplus._M_p = (pointer)&message_id.field_2;
  message_id._M_string_length = 0;
  message_id.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"0",&local_d1);
  lVar6 = 0;
  iVar5 = 0;
  uVar4 = extraout_RDX;
  for (lVar7 = 0; lVar7 < *(int *)(desc + 0x2c); lVar7 = lVar7 + 1) {
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)(*(long *)(desc + 0x30) + lVar6));
    if (!bVar1) {
      iVar2 = *(int *)(*(long *)(desc + 0x30) + 0x38 + lVar6);
      if (iVar5 < iVar2) {
        iVar5 = iVar2;
      }
    }
    lVar6 = lVar6 + 0xa8;
    uVar4 = extraout_RDX_00;
  }
  iVar2 = 0x1fffffff;
  if (iVar5 < 0x1fffffff) {
    iVar2 = iVar5;
  }
  this_00 = (Descriptor *)0xffffffff;
  if (0 < *(int *)(desc + 0x68)) {
    this_00 = (Descriptor *)(ulong)(iVar2 + 1);
  }
  SimpleItoa_abi_cxx11_(&local_90,(protobuf *)this_00,(int)uVar4);
  bVar1 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,this_00);
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)psVar3);
    std::operator+(&local_b0,&local_d0,".repeatedFields_");
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"null",(allocator<char> *)&local_d0);
  }
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            (&local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)psVar3);
  psVar3 = &local_70;
  io::Printer::Print(printer,
                     "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, $rptfields$, $oneoffields$);\n"
                     ,"messageId",psVar3,"pivot",&local_90,"rptfields",&local_b0,"oneoffields",
                     &local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)psVar3);
  io::Printer::Print(printer,
                     "};\ngoog.inherits($classname$, jspb.Message);\nif (goog.DEBUG && !COMPILED) {\n  $classname$.displayName = \'$classname$\';\n}\n"
                     ,"classname",&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&message_id);
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classname$ = function(opt_data) {\n",
      "classname", GetMessagePath(options, desc));
  string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId", !message_id.empty() ?
                   ("'" + message_id + "'") :
                   (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc),
      "rptfields", RepeatedFieldsArrayName(options, desc),
      "oneoffields", OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}